

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::QToolButton(QToolButton *this,QWidget *parent)

{
  QToolButtonPrivate *this_00;
  
  this_00 = (QToolButtonPrivate *)operator_new(0x310);
  QToolButtonPrivate::QToolButtonPrivate(this_00);
  QAbstractButton::QAbstractButton
            (&this->super_QAbstractButton,(QAbstractButtonPrivate *)this_00,parent);
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget = &PTR_metaObject_007d8ce0;
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__QToolButton_007d8eb0;
  QToolButtonPrivate::init
            (*(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QToolButton::QToolButton(QWidget * parent)
    : QAbstractButton(*new QToolButtonPrivate, parent)
{
    Q_D(QToolButton);
    d->init();
}